

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.cpp
# Opt level: O0

btScalar __thiscall
btConvexConvexAlgorithm::calculateTimeOfImpact
          (btConvexConvexAlgorithm *this,btCollisionObject *col0,btCollisionObject *col1,
          btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  float fVar1;
  bool bVar2;
  btTransform *pbVar3;
  btVoronoiSimplexSolver *this_00;
  btCollisionObject *in_RDX;
  btCollisionObject *in_RSI;
  btScalar bVar4;
  btScalar bVar5;
  btGjkConvexCast ccd1_1;
  btVoronoiSimplexSolver voronoiSimplex_1;
  CastResult result_1;
  btSphereShape sphere0;
  btConvexShape *convex1;
  btGjkConvexCast ccd1;
  btVoronoiSimplexSolver voronoiSimplex;
  CastResult result;
  btSphereShape sphere1;
  btConvexShape *convex0;
  btScalar squareMot1;
  btScalar squareMot0;
  btScalar resultFraction;
  btVoronoiSimplexSolver *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  undefined4 in_stack_fffffffffffff9e8;
  btScalar in_stack_fffffffffffff9ec;
  btGjkConvexCast *in_stack_fffffffffffff9f0;
  btVoronoiSimplexSolver *in_stack_fffffffffffffa20;
  CastResult *in_stack_fffffffffffffc70;
  btTransform *in_stack_fffffffffffffc78;
  btTransform *in_stack_fffffffffffffc80;
  btTransform *in_stack_fffffffffffffc88;
  float in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  btGjkConvexCast *in_stack_fffffffffffffc98;
  CastResult local_170;
  btCollisionShape *local_68;
  btScalar local_5c [4];
  float local_4c;
  btScalar local_48 [4];
  btScalar local_38;
  btScalar local_34;
  btCollisionObject *local_20;
  btCollisionObject *local_18;
  btScalar local_4;
  
  local_34 = 1.0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pbVar3 = btCollisionObject::getInterpolationWorldTransform(in_RSI);
  btTransform::getOrigin(pbVar3);
  pbVar3 = btCollisionObject::getWorldTransform(local_18);
  btTransform::getOrigin(pbVar3);
  local_48 = (btScalar  [4])
             operator-((btVector3 *)in_stack_fffffffffffff9f0,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  local_38 = btVector3::length2((btVector3 *)0x196165);
  pbVar3 = btCollisionObject::getInterpolationWorldTransform(local_20);
  btTransform::getOrigin(pbVar3);
  pbVar3 = btCollisionObject::getWorldTransform(local_20);
  btTransform::getOrigin(pbVar3);
  local_5c = (btScalar  [4])
             operator-((btVector3 *)in_stack_fffffffffffff9f0,
                       (btVector3 *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  local_4c = btVector3::length2((btVector3 *)0x1961c9);
  bVar5 = local_38;
  bVar4 = btCollisionObject::getCcdSquareMotionThreshold(local_18);
  fVar1 = local_4c;
  if ((bVar4 <= bVar5) ||
     (bVar5 = btCollisionObject::getCcdSquareMotionThreshold(local_20), bVar5 <= fVar1)) {
    if ((disableCcd & 1U) == 0) {
      local_68 = btCollisionObject::getCollisionShape(local_18);
      btCollisionObject::getCcdSweptSphereRadius(local_20);
      btSphereShape::btSphereShape
                ((btSphereShape *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
      btConvexCast::CastResult::CastResult
                ((CastResult *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
      btVoronoiSimplexSolver::btVoronoiSimplexSolver(in_stack_fffffffffffffa20);
      btGjkConvexCast::btGjkConvexCast
                (in_stack_fffffffffffff9f0,
                 (btConvexShape *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (btConvexShape *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                 in_stack_fffffffffffff9d8);
      btCollisionObject::getWorldTransform(local_18);
      btCollisionObject::getInterpolationWorldTransform(local_18);
      btCollisionObject::getWorldTransform(local_20);
      this_00 = (btVoronoiSimplexSolver *)
                btCollisionObject::getInterpolationWorldTransform(local_20);
      bVar2 = btGjkConvexCast::calcTimeOfImpact
                        (in_stack_fffffffffffffc98,
                         (btTransform *)
                         CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                         in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                         in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      if (bVar2) {
        bVar5 = btCollisionObject::getHitFraction(local_18);
        if (local_170.m_fraction < bVar5) {
          btCollisionObject::setHitFraction(local_18,local_170.m_fraction);
        }
        bVar5 = btCollisionObject::getHitFraction(local_20);
        if (local_170.m_fraction < bVar5) {
          btCollisionObject::setHitFraction(local_20,local_170.m_fraction);
        }
        if (local_170.m_fraction < local_34) {
          local_34 = local_170.m_fraction;
        }
      }
      btGjkConvexCast::~btGjkConvexCast((btGjkConvexCast *)0x196466);
      btConvexCast::CastResult::~CastResult(&local_170);
      btSphereShape::~btSphereShape((btSphereShape *)0x196480);
      btCollisionObject::getCollisionShape(local_20);
      btCollisionObject::getCcdSweptSphereRadius(local_18);
      btSphereShape::btSphereShape
                ((btSphereShape *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec);
      btConvexCast::CastResult::CastResult
                ((CastResult *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
      btVoronoiSimplexSolver::btVoronoiSimplexSolver(this_00);
      btGjkConvexCast::btGjkConvexCast
                (in_stack_fffffffffffff9f0,
                 (btConvexShape *)CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                 (btConvexShape *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                 in_stack_fffffffffffff9d8);
      btCollisionObject::getWorldTransform(local_18);
      btCollisionObject::getInterpolationWorldTransform(local_18);
      btCollisionObject::getWorldTransform(local_20);
      btCollisionObject::getInterpolationWorldTransform(local_20);
      bVar2 = btGjkConvexCast::calcTimeOfImpact
                        (in_stack_fffffffffffffc98,
                         (btTransform *)
                         CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                         in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                         in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      if (bVar2) {
        bVar5 = btCollisionObject::getHitFraction(local_18);
        if (in_stack_fffffffffffffc90 < bVar5) {
          btCollisionObject::setHitFraction(local_18,in_stack_fffffffffffffc90);
        }
        bVar5 = btCollisionObject::getHitFraction(local_20);
        if (in_stack_fffffffffffffc90 < bVar5) {
          btCollisionObject::setHitFraction(local_20,in_stack_fffffffffffffc90);
        }
        if (in_stack_fffffffffffffc90 < local_34) {
          local_34 = in_stack_fffffffffffffc90;
        }
      }
      btGjkConvexCast::~btGjkConvexCast((btGjkConvexCast *)0x1966ad);
      btConvexCast::CastResult::~CastResult((CastResult *)&stack0xfffffffffffffbe8);
      btSphereShape::~btSphereShape((btSphereShape *)0x1966c7);
      local_4 = local_34;
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

btScalar	btConvexConvexAlgorithm::calculateTimeOfImpact(btCollisionObject* col0,btCollisionObject* col1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	///Rather then checking ALL pairs, only calculate TOI when motion exceeds threshold
    
	///Linear motion for one of objects needs to exceed m_ccdSquareMotionThreshold
	///col0->m_worldTransform,
	btScalar resultFraction = btScalar(1.);


	btScalar squareMot0 = (col0->getInterpolationWorldTransform().getOrigin() - col0->getWorldTransform().getOrigin()).length2();
	btScalar squareMot1 = (col1->getInterpolationWorldTransform().getOrigin() - col1->getWorldTransform().getOrigin()).length2();
    
	if (squareMot0 < col0->getCcdSquareMotionThreshold() &&
		squareMot1 < col1->getCcdSquareMotionThreshold())
		return resultFraction;

	if (disableCcd)
		return btScalar(1.);


	//An adhoc way of testing the Continuous Collision Detection algorithms
	//One object is approximated as a sphere, to simplify things
	//Starting in penetration should report no time of impact
	//For proper CCD, better accuracy and handling of 'allowed' penetration should be added
	//also the mainloop of the physics should have a kind of toi queue (something like Brian Mirtich's application of Timewarp for Rigidbodies)

		
	/// Convex0 against sphere for Convex1
	{
		btConvexShape* convex0 = static_cast<btConvexShape*>(col0->getCollisionShape());

		btSphereShape	sphere1(col1->getCcdSweptSphereRadius()); //todo: allow non-zero sphere sizes, for better approximation
		btConvexCast::CastResult result;
		btVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		btGjkConvexCast ccd1( convex0 ,&sphere1,&voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(),col0->getInterpolationWorldTransform(),
			col1->getWorldTransform(),col1->getInterpolationWorldTransform(),result))
		{
		
			//store result.m_fraction in both bodies
		
			if (col0->getHitFraction()> result.m_fraction)
				col0->setHitFraction( result.m_fraction );

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction( result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;

		}
		
		


	}

	/// Sphere (for convex0) against Convex1
	{
		btConvexShape* convex1 = static_cast<btConvexShape*>(col1->getCollisionShape());

		btSphereShape	sphere0(col0->getCcdSweptSphereRadius()); //todo: allow non-zero sphere sizes, for better approximation
		btConvexCast::CastResult result;
		btVoronoiSimplexSolver voronoiSimplex;
		//SubsimplexConvexCast ccd0(&sphere,min0,&voronoiSimplex);
		///Simplification, one object is simplified as a sphere
		btGjkConvexCast ccd1(&sphere0,convex1,&voronoiSimplex);
		//ContinuousConvexCollision ccd(min0,min1,&voronoiSimplex,0);
		if (ccd1.calcTimeOfImpact(col0->getWorldTransform(),col0->getInterpolationWorldTransform(),
			col1->getWorldTransform(),col1->getInterpolationWorldTransform(),result))
		{
		
			//store result.m_fraction in both bodies
		
			if (col0->getHitFraction()	> result.m_fraction)
				col0->setHitFraction( result.m_fraction);

			if (col1->getHitFraction() > result.m_fraction)
				col1->setHitFraction( result.m_fraction);

			if (resultFraction > result.m_fraction)
				resultFraction = result.m_fraction;

		}
	}
	
	return resultFraction;

}